

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketProcessor.cpp
# Opt level: O2

void __thiscall PacketProcessor::feed(PacketProcessor *this,void *d,size_t size)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  uint32_t uVar1;
  long lVar2;
  pthread_mutex_t *__mutex;
  pointer puVar3;
  ulong uVar4;
  const_iterator __position;
  undefined8 local_48 [4];
  
  if (size == 0) {
    return;
  }
  this_00 = &this->buffer_;
  puVar3 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  __position._M_current =
       (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (puVar3 == __position._M_current) {
LAB_001036c8:
    uVar4 = 1;
    for (lVar2 = 0; -lVar2 != size; lVar2 = lVar2 + -1) {
      if (*(char *)((long)d + (uVar4 - 1)) == 'Z') {
        if (size <= uVar4) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    (this_00,(value_type_conflict *)((long)d - lVar2));
          return;
        }
        if (*(char *)((long)d + uVar4) == -0x5b) {
          puVar3 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          __position._M_current =
               (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          lVar2 = -lVar2;
          goto LAB_00103721;
        }
      }
      uVar4 = uVar4 + 1;
    }
  }
  else {
    if ((long)__position._M_current - (long)puVar3 == 1) {
      if (*puVar3 != 'Z') {
        __assert_fail("buffer_[0] == H_1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/shuai132[P]PacketProcessor/PacketProcessor.cpp"
                      ,0x7b,"void PacketProcessor::feed(const void *, size_t)");
      }
      if (*d != -0x5b) {
        (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar3;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_shrink_to_fit(this_00);
        goto LAB_001036c8;
      }
    }
    lVar2 = 0;
LAB_00103721:
    if ((uchar *)(ulong)this->maxBufferSize_ <
        __position._M_current + (size - (long)(puVar3 + lVar2))) {
      __mutex = (pthread_mutex_t *)L_O_G_NS_MUTEX::mutex();
      std::mutex::lock((mutex *)&__mutex->__data);
      L_O_G_NS_GET_TIME::get_time_abi_cxx11_();
      uVar1 = L_O_G_NS_GET_TID::get_tid();
      printf("\x1b[35m%s %u [W]: %s:%d [%s] size too big, need: %zu, max: %zu\x1b[m\n",local_48[0],
             (ulong)uVar1,"PacketProcessor.cpp",0x87,"feed",
             __position._M_current + (size - (long)(puVar3 + lVar2)),(ulong)this->maxBufferSize_);
      std::__cxx11::string::~string((string *)local_48);
      pthread_mutex_unlock(__mutex);
      clearBuffer(this);
      return;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,__position,
               (uchar *)((long)d + lVar2),(uchar *)((long)d + (size - lVar2)));
  }
  tryUnpack(this);
  return;
}

Assistant:

void PacketProcessor::feed(const void* d, size_t size) {
  const uint8_t* data = (uint8_t*)d;
  if (size == 0) return;
  PacketProcessor_LOGV("feed: %u", size);

  // 缓存数据(当遇到包头后才开始缓存)
  size_t startPos = 0;
  if (buffer_.empty()) {
  START_HEADER:
    FOR(i, size) {
      if (data[i] == H_1) {
        if (i + 1 < size) {
          if (data[i + 1] == H_2) {
            startPos = i;
            goto START_BUFFER;
          } else {
            continue;
          }
        } else {
          buffer_.push_back(data[i]);
          return;
        }
      }
    }
  } else if (buffer_.size() == 1) {
    assert(buffer_[0] == H_1);
    if (data[0] == H_2)
      goto START_BUFFER;
    else {
      buffer_.clear();
      buffer_.shrink_to_fit();
      goto START_HEADER;
    }
  } else {
  START_BUFFER:
    const auto needSize = buffer_.size() + size - startPos;
    if (needSize > maxBufferSize_) {
      PacketProcessor_LOGW("size too big, need: %zu, max: %zu", needSize, (size_t)maxBufferSize_);
      clearBuffer();
      return;
    }
    buffer_.insert(buffer_.end(), data + startPos, data + size - startPos);
  }

  // 尝试解包
  tryUnpack();
}